

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
          *this,quad<unsigned_short> *param_1)

{
  ushort uVar1;
  pixel_type pVar2;
  pixel_type pVar3;
  pixel_type pVar4;
  pixel_type pVar5;
  undefined4 uVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 local_54;
  sample_type sStack_52;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 aStack_50;
  anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2 aStack_4e;
  quad<unsigned_short> rx;
  int32_t qs4;
  int32_t qs3;
  int32_t qs2;
  int32_t qs1;
  quad<unsigned_short> rd;
  quad<unsigned_short> rb;
  quad<unsigned_short> rc;
  quad<unsigned_short> ra;
  int32_t index;
  quad<unsigned_short> *param_1_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
  *this_local;
  
  ra.super_triplet<unsigned_short>.field_0 =
       (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)0x0;
  ra.super_triplet<unsigned_short>.field_1 =
       (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)0x0;
  while ((uint)ra.super_triplet<unsigned_short>._0_4_ < this->width_) {
    pVar2 = this->current_line_[ra.super_triplet<unsigned_short>._0_4_ + -1];
    pVar3 = this->previous_line_[ra.super_triplet<unsigned_short>._0_4_ + -1];
    pVar4 = this->previous_line_[(int)ra.super_triplet<unsigned_short>._0_4_];
    pVar5 = this->previous_line_[ra.super_triplet<unsigned_short>._0_4_ + 1];
    qs2._0_2_ = pVar5.super_triplet<unsigned_short>.field_0;
    rd.super_triplet<unsigned_short>.field_0.v1 = pVar4.super_triplet<unsigned_short>.field_0;
    iVar7 = quantize_gradient(this,(uint)qs2._0_2_ -
                                   (uint)rd.super_triplet<unsigned_short>.field_0.v1);
    rb.super_triplet<unsigned_short>.field_0.v1 = pVar3.super_triplet<unsigned_short>.field_0;
    iVar8 = quantize_gradient(this,(uint)rd.super_triplet<unsigned_short>.field_0.v1 -
                                   (uint)rb.super_triplet<unsigned_short>.field_0.v1);
    rc.super_triplet<unsigned_short>.field_0.v1 = pVar2.super_triplet<unsigned_short>.field_0;
    iVar9 = quantize_gradient(this,(uint)rb.super_triplet<unsigned_short>.field_0.v1 -
                                   (uint)rc.super_triplet<unsigned_short>.field_0.v1);
    iVar7 = compute_context_id(iVar7,iVar8,iVar9);
    qs2._2_2_ = pVar5.super_triplet<unsigned_short>.field_1;
    rd.super_triplet<unsigned_short>.field_1.v2 = pVar4.super_triplet<unsigned_short>.field_1;
    iVar8 = quantize_gradient(this,(uint)qs2._2_2_ -
                                   (uint)rd.super_triplet<unsigned_short>.field_1.v2);
    rb.super_triplet<unsigned_short>.field_1.v2 = pVar3.super_triplet<unsigned_short>.field_1;
    iVar9 = quantize_gradient(this,(uint)rd.super_triplet<unsigned_short>.field_1.v2 -
                                   (uint)rb.super_triplet<unsigned_short>.field_1.v2);
    rc.super_triplet<unsigned_short>.field_1.v2 = pVar2.super_triplet<unsigned_short>.field_1;
    iVar10 = quantize_gradient(this,(uint)rb.super_triplet<unsigned_short>.field_1.v2 -
                                    (uint)rc.super_triplet<unsigned_short>.field_1.v2);
    iVar8 = compute_context_id(iVar8,iVar9,iVar10);
    qs1._0_2_ = pVar5.super_triplet<unsigned_short>.field_2;
    rd.super_triplet<unsigned_short>.field_2.v3 = pVar4.super_triplet<unsigned_short>.field_2;
    iVar9 = quantize_gradient(this,(uint)qs1._0_2_ -
                                   (uint)rd.super_triplet<unsigned_short>.field_2.v3);
    rb.super_triplet<unsigned_short>.field_2.v3 = pVar3.super_triplet<unsigned_short>.field_2;
    iVar10 = quantize_gradient(this,(uint)rd.super_triplet<unsigned_short>.field_2.v3 -
                                    (uint)rb.super_triplet<unsigned_short>.field_2.v3);
    rc.super_triplet<unsigned_short>.field_2.v3 = pVar2.super_triplet<unsigned_short>.field_2;
    iVar11 = quantize_gradient(this,(uint)rb.super_triplet<unsigned_short>.field_2.v3 -
                                    (uint)rc.super_triplet<unsigned_short>.field_2.v3);
    rx._4_4_ = compute_context_id(iVar9,iVar10,iVar11);
    qs1._2_2_ = pVar5.field_0;
    rd.field_0 = pVar4.field_0;
    iVar9 = quantize_gradient(this,(uint)qs1._2_2_ - (uint)rd.field_0.v4);
    rb.field_0 = pVar3.field_0;
    iVar10 = quantize_gradient(this,(uint)rd.field_0.v4 - (uint)rb.field_0.v4);
    rc.field_0 = pVar2.field_0;
    iVar11 = quantize_gradient(this,(uint)rb.field_0.v4 - (uint)rc.field_0.v4);
    rx.super_triplet<unsigned_short>._0_4_ = compute_context_id(iVar9,iVar10,iVar11);
    if ((((iVar7 == 0) && (iVar8 == 0)) && (rx._4_4_ == 0)) &&
       (rx.super_triplet<unsigned_short>._0_4_ == 0)) {
      iVar7 = do_run_mode(this,ra.super_triplet<unsigned_short>._0_4_,(encoder_strategy *)0x0);
      ra.super_triplet<unsigned_short>._0_4_ = iVar7 + ra.super_triplet<unsigned_short>._0_4_;
    }
    else {
      quad<unsigned_short>::quad((quad<unsigned_short> *)&local_54);
      uVar1 = this->current_line_[(int)ra.super_triplet<unsigned_short>._0_4_].
              super_triplet<unsigned_short>.field_0.v1;
      iVar9 = get_predicted_value((uint)rc.super_triplet<unsigned_short>.field_0.v1,
                                  (uint)rd.super_triplet<unsigned_short>.field_0.v1,
                                  (uint)rb.super_triplet<unsigned_short>.field_0.v1);
      local_54.v1 = do_regular(this,iVar7,(uint)uVar1,iVar9,(encoder_strategy *)0x0);
      uVar1 = this->current_line_[(int)ra.super_triplet<unsigned_short>._0_4_].
              super_triplet<unsigned_short>.field_1.v2;
      iVar7 = get_predicted_value((uint)rc.super_triplet<unsigned_short>.field_1.v2,
                                  (uint)rd.super_triplet<unsigned_short>.field_1.v2,
                                  (uint)rb.super_triplet<unsigned_short>.field_1.v2);
      sStack_52 = do_regular(this,iVar8,(uint)uVar1,iVar7,(encoder_strategy *)0x0);
      uVar6 = rx._4_4_;
      uVar1 = this->current_line_[(int)ra.super_triplet<unsigned_short>._0_4_].
              super_triplet<unsigned_short>.field_2.v3;
      iVar7 = get_predicted_value((uint)rc.super_triplet<unsigned_short>.field_2.v3,
                                  (uint)rd.super_triplet<unsigned_short>.field_2.v3,
                                  (uint)rb.super_triplet<unsigned_short>.field_2.v3);
      aStack_50.v3 = do_regular(this,uVar6,(uint)uVar1,iVar7,(encoder_strategy *)0x0);
      uVar6 = rx.super_triplet<unsigned_short>._0_4_;
      uVar1 = this->current_line_[(int)ra.super_triplet<unsigned_short>._0_4_].field_0.v4;
      iVar7 = get_predicted_value((uint)rc.field_0.v4,(uint)rd.field_0.v4,(uint)rb.field_0.v4);
      aStack_4e.v4 = do_regular(this,uVar6,(uint)uVar1,iVar7,(encoder_strategy *)0x0);
      pVar2.super_triplet<unsigned_short>.field_1.v2 = sStack_52;
      pVar2.super_triplet<unsigned_short>.field_0.v1 = local_54.v1;
      pVar2.super_triplet<unsigned_short>.field_2.v3 = aStack_50.v3;
      pVar2.field_0.v4 = aStack_4e.v4;
      this->current_line_[(int)ra.super_triplet<unsigned_short>._0_4_] = pVar2;
      ra.super_triplet<unsigned_short>._0_4_ = ra.super_triplet<unsigned_short>._0_4_ + 1;
    }
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }